

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getInteratomicVector
          (ForceMatrixDecomposition *this,int atom1,int atom2)

{
  Vector<double,_3U> *v1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Vector<double,_3U> *in_RDI;
  Vector3d *in_stack_00000028;
  Snapshot *in_stack_00000030;
  Vector3d *d;
  
  Vector3<double>::Vector3((Vector3<double> *)0x1eaba2);
  v1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (*(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> **)
                    (in_RSI + 0x18),(long)in_ECX)->super_Vector<double,_3U>;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            (*(vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> **)
              (in_RSI + 0x18),(long)in_EDX);
  OpenMD::operator-(v1,in_RDI);
  Vector3<double>::operator=((Vector3<double> *)v1,in_RDI);
  if ((*(byte *)(in_RSI + 0x3d) & 1) != 0) {
    Snapshot::wrapVector(in_stack_00000030,in_stack_00000028);
  }
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d ForceMatrixDecomposition::getInteratomicVector(int atom1,
                                                          int atom2) {
    Vector3d d;

#ifdef IS_MPI
    d = atomColData.position[atom2] - atomRowData.position[atom1];
#else
    d = snap_->atomData.position[atom2] - snap_->atomData.position[atom1];
#endif
    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }